

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O2

UBool isValidOlsonID(char *id)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  
  bVar4 = true;
  pcVar3 = id;
  do {
    cVar1 = *pcVar3;
    if (cVar1 == '\0') {
      return '\x01';
    }
  } while ((cVar1 != ',') && (pcVar3 = pcVar3 + 1, 9 < (byte)(cVar1 - 0x30U)));
  iVar2 = strcmp(id,"PST8PDT");
  if ((iVar2 != 0) &&
     ((iVar2 = strcmp(id,"MST7MDT"), iVar2 != 0 && (iVar2 = strcmp(id,"CST6CDT"), iVar2 != 0)))) {
    iVar2 = strcmp(id,"EST5EDT");
    bVar4 = iVar2 == 0;
  }
  return bVar4;
}

Assistant:

static UBool isValidOlsonID(const char *id) {
    int32_t idx = 0;

    /* Determine if this is something like Iceland (Olson ID)
    or AST4ADT (non-Olson ID) */
    while (id[idx] && isNonDigit(id[idx]) && id[idx] != ',') {
        idx++;
    }

    /* If we went through the whole string, then it might be okay.
    The timezone is sometimes set to "CST-7CDT", "CST6CDT5,J129,J131/19:30",
    "GRNLNDST3GRNLNDDT" or similar, so we cannot use it.
    The rest of the time it could be an Olson ID. George */
    return (UBool)(id[idx] == 0
        || uprv_strcmp(id, "PST8PDT") == 0
        || uprv_strcmp(id, "MST7MDT") == 0
        || uprv_strcmp(id, "CST6CDT") == 0
        || uprv_strcmp(id, "EST5EDT") == 0);
}